

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O2

mbedtls_ssl_ciphersuite_t * mbedtls_ssl_ciphersuite_from_id(int ciphersuite)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  
  pmVar1 = ciphersuite_definitions;
  while( true ) {
    if (pmVar1->id == 0) {
      return (mbedtls_ssl_ciphersuite_t *)0x0;
    }
    if (pmVar1->id == ciphersuite) break;
    pmVar1 = pmVar1 + 1;
  }
  return pmVar1;
}

Assistant:

const mbedtls_ssl_ciphersuite_t *mbedtls_ssl_ciphersuite_from_id(int ciphersuite)
{
    const mbedtls_ssl_ciphersuite_t *cur = ciphersuite_definitions;

    while (cur->id != 0) {
        if (cur->id == ciphersuite) {
            return cur;
        }

        cur++;
    }

    return NULL;
}